

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_engine.cpp
# Opt level: O2

void __thiscall duckdb::RandomEngine::RandomEngine(RandomEngine *this,int64_t seed)

{
  pointer pRVar1;
  unsigned_long uVar2;
  long lVar3;
  idx_t random_seed;
  
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  make_uniq<duckdb::RandomState>();
  if (seed < 0) {
    random_seed = 0;
    lVar3 = syscall(0x13e,&random_seed,8,0);
    if ((int)lVar3 == -1) {
      random_seed = ::std::chrono::_V2::system_clock::now();
    }
    pRVar1 = unique_ptr<duckdb::RandomState,_std::default_delete<duckdb::RandomState>,_true>::
             operator->(&this->random_state);
    (pRVar1->pcg).super_specific_stream<unsigned_long>.inc_ = 0x14057b7ef767814f;
    (pRVar1->pcg).state_ = random_seed * 0x5851f42d4c957f2d + 0x1a08ee1184ba6d32;
  }
  else {
    pRVar1 = unique_ptr<duckdb::RandomState,_std::default_delete<duckdb::RandomState>,_true>::
             operator->(&this->random_state);
    uVar2 = NumericCastImpl<unsigned_long,_long,_false>::Convert(seed);
    (pRVar1->pcg).super_specific_stream<unsigned_long>.inc_ = 0x14057b7ef767814f;
    (pRVar1->pcg).state_ = uVar2 * 0x5851f42d4c957f2d + 0x1a08ee1184ba6d32;
  }
  return;
}

Assistant:

RandomEngine::RandomEngine(int64_t seed) : random_state(make_uniq<RandomState>()) {
	if (seed < 0) {
#ifdef __linux__
		idx_t random_seed = 0;
		int result = -1;
#if defined(SYS_getrandom)
		result = static_cast<int>(syscall(SYS_getrandom, &random_seed, sizeof(random_seed), 0));
#endif
		if (result == -1) {
			// Something went wrong with the syscall, we use chrono
			const auto now = std::chrono::high_resolution_clock::now();
			random_seed = now.time_since_epoch().count();
		}
		random_state->pcg.seed(random_seed);
#else
		random_state->pcg.seed(pcg_extras::seed_seq_from<std::random_device>());
#endif
	} else {
		random_state->pcg.seed(NumericCast<uint64_t>(seed));
	}
}